

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

int __thiscall CDemoPlayer::SetPos(CDemoPlayer *this,int WantedTick)

{
  int iVar1;
  int iVar2;
  CKeyFrame *pCVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int *piVar13;
  int iVar14;
  ulong uVar12;
  
  if (this->m_File == (IOHANDLE)0x0) {
    iVar5 = -1;
  }
  else {
    iVar5 = (this->m_Info).m_Info.m_FirstTick;
    iVar1 = (this->m_Info).m_Info.m_LastTick;
    iVar14 = iVar1;
    if (WantedTick < iVar1) {
      iVar14 = WantedTick;
    }
    if (WantedTick < iVar5) {
      iVar14 = iVar5;
    }
    iVar4 = iVar14 + -5;
    iVar2 = (this->m_Info).m_SeekablePoints;
    uVar6 = (uint)((float)iVar2 * ((float)(iVar4 - iVar5) / (float)(iVar1 - iVar5)));
    uVar10 = (long)iVar2 - 1;
    uVar8 = (uint)uVar10;
    uVar7 = uVar8;
    if ((int)uVar6 < (int)uVar8) {
      uVar7 = uVar6;
    }
    uVar11 = 0;
    if (-1 < (int)uVar6) {
      uVar11 = uVar7;
    }
    uVar12 = (ulong)(int)uVar11;
    uVar9 = uVar10 & 0xffffffff;
    if ((int)uVar8 < (int)uVar11) {
      uVar9 = (ulong)uVar11;
    }
    pCVar3 = this->m_pKeyFrames;
    piVar13 = &pCVar3[uVar12].m_Tick;
    for (; (long)uVar12 < (long)uVar10; uVar12 = uVar12 + 1) {
      if (iVar4 <= *piVar13) {
        uVar9 = uVar12 & 0xffffffff;
        break;
      }
      piVar13 = piVar13 + 4;
    }
    uVar7 = (uint)uVar9;
    while ((uVar8 = (uint)uVar9, uVar6 = (int)uVar7 >> 0x1f & uVar7, 0 < (int)uVar8 &&
           (uVar6 = uVar8, iVar4 < pCVar3[uVar9].m_Tick))) {
      uVar9 = (ulong)(uVar8 - 1);
    }
    io_seek(this->m_File,(int)pCVar3[(int)uVar6].m_Filepos,0);
    (this->m_Info).m_NextTick = -1;
    (this->m_Info).m_PreviousTick = -1;
    (this->m_Info).m_Info.m_CurrentTick = -1;
    iVar5 = -1;
    while (iVar5 < iVar14) {
      DoTick(this);
      iVar5 = (this->m_Info).m_NextTick;
    }
    Play(this);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int CDemoPlayer::SetPos(int WantedTick)
{
	if(!m_File)
		return -1;

	WantedTick = clamp(WantedTick, m_Info.m_Info.m_FirstTick, m_Info.m_Info.m_LastTick);
	int KeyframeWantedTick = WantedTick - 5; // -5 because we have to have a current tick and previous tick when we do the playback
	const float Percent = (KeyframeWantedTick - m_Info.m_Info.m_FirstTick) / float(m_Info.m_Info.m_LastTick - m_Info.m_Info.m_FirstTick);

	// get correct key frame
	int Keyframe = clamp((int)(m_Info.m_SeekablePoints*Percent), 0, m_Info.m_SeekablePoints-1);
	while(Keyframe < m_Info.m_SeekablePoints-1 && m_pKeyFrames[Keyframe].m_Tick < KeyframeWantedTick)
		Keyframe++;
	while(Keyframe > 0 && m_pKeyFrames[Keyframe].m_Tick > KeyframeWantedTick)
		Keyframe--;

	// seek to the correct keyframe
	io_seek(m_File, m_pKeyFrames[Keyframe].m_Filepos, IOSEEK_START);

	m_Info.m_NextTick = -1;
	m_Info.m_Info.m_CurrentTick = -1;
	m_Info.m_PreviousTick = -1;

	// playback everything until we hit our tick
	while(m_Info.m_NextTick < WantedTick)
		DoTick();

	Play();

	return 0;
}